

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

nbt_list * clone_list(nbt_list *list)

{
  int *piVar1;
  nbt_node *pnVar2;
  long *__ptr;
  nbt_list *new;
  nbt_list *current;
  list_head *pos;
  nbt_list *ret;
  nbt_list *list_local;
  
  if (list == (nbt_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x53,"struct nbt_list *clone_list(struct nbt_list *)");
  }
  list_local = (nbt_list *)malloc(0x18);
  if (list_local == (nbt_list *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
LAB_00103d81:
    nbt_free_list(list_local);
    list_local = (nbt_list *)0x0;
  }
  else {
    (list_local->entry).blink = &list_local->entry;
    (list_local->entry).flink = &list_local->entry;
    list_local->data = (nbt_node *)0x0;
    if (list->data != (nbt_node *)0x0) {
      pnVar2 = (nbt_node *)malloc(0x20);
      list_local->data = pnVar2;
      if (pnVar2 == (nbt_node *)0x0) {
        piVar1 = __errno_location();
        *piVar1 = -2;
        goto LAB_00103d81;
      }
      list_local->data->type = list->data->type;
    }
    for (current = (nbt_list *)(list->entry).flink; current != (nbt_list *)&list->entry;
        current = (nbt_list *)(current->entry).blink) {
      __ptr = (long *)malloc(0x18);
      if (__ptr == (long *)0x0) {
        piVar1 = __errno_location();
        *piVar1 = -2;
        goto LAB_00103d81;
      }
      pnVar2 = nbt_clone((nbt_node *)current[-1].entry.flink);
      *__ptr = (long)pnVar2;
      if (*__ptr == 0) {
        free(__ptr);
        goto LAB_00103d81;
      }
      list_add_tail((list_head *)(__ptr + 1),&list_local->entry);
    }
  }
  return list_local;
}

Assistant:

static struct nbt_list* clone_list(struct nbt_list* list)
{
    /* even empty lists are valid pointers! */
    assert(list);

    struct nbt_list* ret;
    CHECKED_MALLOC(ret, sizeof *ret, goto clone_error);

    INIT_LIST_HEAD(&ret->entry);

    ret->data = NULL;

    if(list->data != NULL)
    {
        CHECKED_MALLOC(ret->data, sizeof *ret->data, goto clone_error);
        ret->data->type = list->data->type;
    }

    struct list_head* pos;
    list_for_each(pos, &list->entry)
    {
        struct nbt_list* current = list_entry(pos, struct nbt_list, entry);
        struct nbt_list* new;

        CHECKED_MALLOC(new, sizeof *new, goto clone_error);

        new->data = nbt_clone(current->data);

        if(new->data == NULL)
        {
            free(new);
            goto clone_error;
        }

        list_add_tail(&new->entry, &ret->entry);
    }

    return ret;

clone_error:
    nbt_free_list(ret);
    return NULL;
}